

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O0

float ggml_compute_fp16_to_fp32(ggml_fp16_t h)

{
  uint uVar1;
  ushort in_DI;
  float fVar2;
  float fVar3;
  uint32_t result;
  uint32_t denormalized_cutoff;
  float denormalized_value;
  float magic_bias;
  uint32_t magic_mask;
  float normalized_value;
  float exp_scale;
  uint32_t exp_offset;
  uint32_t two_w;
  uint32_t sign;
  uint32_t w;
  undefined4 local_38;
  
  uVar1 = (uint)in_DI;
  fVar2 = fp32_from_bits((uVar1 * 0x20000 >> 4) + 0x70000000);
  fVar3 = fp32_from_bits(uVar1 & 0x7fff | 0x3f000000);
  if (uVar1 * 0x20000 < 0x8000000) {
    local_38 = fp32_to_bits(fVar3 - 0.5);
  }
  else {
    local_38 = fp32_to_bits(fVar2 * 1.92593e-34);
  }
  fVar2 = fp32_from_bits(uVar1 * 0x10000 & 0x80000000 | local_38);
  return fVar2;
}

Assistant:

static inline float ggml_compute_fp16_to_fp32(ggml_fp16_t h) {
        const uint32_t w = (uint32_t) h << 16;
        const uint32_t sign = w & UINT32_C(0x80000000);
        const uint32_t two_w = w + w;

        const uint32_t exp_offset = UINT32_C(0xE0) << 23;
    #if (defined(__STDC_VERSION__) && (__STDC_VERSION__ >= 199901L) || defined(__GNUC__) && !defined(__STRICT_ANSI__)) && (!defined(__cplusplus) || __cplusplus >= 201703L)
        const float exp_scale = 0x1.0p-112f;
    #else
        const float exp_scale = fp32_from_bits(UINT32_C(0x7800000));
    #endif
        const float normalized_value = fp32_from_bits((two_w >> 4) + exp_offset) * exp_scale;

        const uint32_t magic_mask = UINT32_C(126) << 23;
        const float magic_bias = 0.5f;
        const float denormalized_value = fp32_from_bits((two_w >> 17) | magic_mask) - magic_bias;

        const uint32_t denormalized_cutoff = UINT32_C(1) << 27;
        const uint32_t result = sign |
            (two_w < denormalized_cutoff ? fp32_to_bits(denormalized_value) : fp32_to_bits(normalized_value));
        return fp32_from_bits(result);
    }